

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall SummedArea_Randoms_Test::TestBody(SummedArea_Randoms_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  allocator_type allocator;
  Allocator alloc;
  byte bVar6;
  ulong uVar7;
  Array2D<double> *__return_storage_ptr__;
  uint uVar8;
  uint uVar9;
  char *message;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint64_t oldstate;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  Float FVar20;
  undefined1 auVar21 [16];
  string ret;
  Array2D<float> v;
  AssertionResult gtest_ar;
  double s;
  Bounds2f bf;
  SummedAreaTable sat;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  double local_e0;
  int local_d4;
  string local_d0;
  int local_ac;
  Array2D<float> local_a8;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78;
  AssertHelper local_70;
  double local_68;
  undefined1 local_60 [48];
  
  uVar16 = 0x853c49e6748fea9b;
  local_78 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&DAT_005d5ba0 + local_78);
    allocator.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Array2D<float>::Array2D(&local_a8,(int)uVar1,(int)((ulong)uVar1 >> 0x20),allocator);
    if (local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y <
        local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y) {
      uVar8 = local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      iVar10 = 0;
      do {
        if (0 < (int)uVar8) {
          uVar15 = 0;
          uVar7 = uVar16;
          do {
            do {
              uVar16 = uVar7 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
              uVar17 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
              bVar6 = (byte)(uVar7 >> 0x3b);
              uVar17 = uVar17 >> bVar6 | uVar17 << 0x20 - bVar6;
              uVar7 = uVar16;
            } while ((int)uVar17 < 0);
            local_a8.values
            [(int)(((int)uVar15 - local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) +
                  (iVar10 - local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) * uVar8)] =
                 (float)((int)uVar17 % 0x20);
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar8);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 != local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                         local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    __return_storage_ptr__ = (Array2D<double> *)(local_60 + 0x10);
    pbrt::SummedAreaTable::integrate
              (__return_storage_ptr__,(SummedAreaTable *)__return_storage_ptr__,&local_a8,alloc);
    iVar10 = 0;
    do {
      local_ac = local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      uVar8 = local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      uVar17 = -uVar8 % uVar8;
      do {
        uVar9 = (uint)(uVar16 >> 0x2d) ^ (uint)(uVar16 >> 0x1b);
        bVar6 = (byte)(uVar16 >> 0x3b);
        uVar9 = uVar9 >> bVar6 | uVar9 << 0x20 - bVar6;
        if ((int)uVar17 <= (int)uVar9) {
          __return_storage_ptr__ =
               (Array2D<double> *)((long)(int)uVar9 % (long)(int)uVar8 & 0xffffffff);
        }
        uVar16 = uVar16 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar9 < (int)uVar17);
      uVar18 = local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
               local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      uVar7 = (ulong)-uVar18 % (ulong)uVar18;
      do {
        uVar12 = (uint)(uVar16 >> 0x2d) ^ (uint)(uVar16 >> 0x1b);
        bVar6 = (byte)(uVar16 >> 0x3b);
        uVar12 = uVar12 >> bVar6 | uVar12 << 0x20 - bVar6;
        iVar11 = (int)((ulong)-uVar18 % (ulong)uVar18);
        if (iVar11 <= (int)uVar12) {
          uVar7 = (long)(int)uVar12 % (long)(int)uVar18 & 0xffffffff;
          uVar9 = (uint)((long)(int)uVar12 % (long)(int)uVar18);
        }
        uVar16 = uVar16 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar12 < iVar11);
      do {
        uVar14 = (uint)(uVar16 >> 0x2d) ^ (uint)(uVar16 >> 0x1b);
        bVar6 = (byte)(uVar16 >> 0x3b);
        uVar14 = uVar14 >> bVar6 | uVar14 << 0x20 - bVar6;
        if ((int)uVar17 <= (int)uVar14) {
          uVar7 = (long)(int)uVar14 % (long)(int)uVar8 & 0xffffffff;
          uVar12 = (uint)((long)(int)uVar14 % (long)(int)uVar8);
        }
        uVar16 = uVar16 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar14 < (int)uVar17);
      do {
        uVar17 = (uint)(uVar16 >> 0x2d) ^ (uint)(uVar16 >> 0x1b);
        bVar6 = (byte)(uVar16 >> 0x3b);
        uVar17 = uVar17 >> bVar6 | uVar17 << 0x20 - bVar6;
        if (iVar11 <= (int)uVar17) {
          uVar7 = (long)(int)uVar17 % (long)(int)uVar18 & 0xffffffff;
        }
        uVar16 = uVar16 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar17 < iVar11);
      auVar19 = vpinsrd_avx(ZEXT416(uVar12),(uint)uVar7,1);
      auVar21 = vpinsrd_avx(ZEXT416((uint)__return_storage_ptr__),uVar9,1);
      auVar4 = vpminsd_avx(auVar19,auVar21);
      uVar17 = auVar4._0_4_;
      auVar3 = vpmaxsd_avx(auVar21,auVar19);
      auVar19 = vpinsrd_avx(ZEXT416(uVar8),uVar18,1);
      auVar19 = vcvtdq2ps_avx(auVar19);
      auVar21 = vcvtdq2ps_avx(auVar4);
      auVar2 = vdivps_avx(auVar21,auVar19);
      auVar21 = vcvtdq2ps_avx(auVar3);
      auVar19 = vdivps_avx(auVar21,auVar19);
      auVar21 = vminps_avx(auVar19,auVar2);
      auVar19 = vmaxps_avx(auVar19,auVar2);
      local_60._0_16_ = vmovlhps_avx(auVar21,auVar19);
      local_e0 = 0.0;
      if (((int)uVar17 < (int)auVar3._0_4_) && (uVar9 != (uint)uVar7)) {
        uVar13 = (ulong)auVar4._4_4_;
        local_e0 = 0.0;
        uVar7 = (ulong)uVar17;
        uVar15 = auVar4._0_8_;
        do {
          local_e0 = local_e0 +
                     (double)local_a8.values
                             [(int)(((int)uVar13 -
                                    local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) * uVar8
                                   + ((int)uVar7 -
                                     local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x))];
          uVar9 = (int)uVar7 + 1;
          uVar7 = (uVar15 & 0xffffffff00000000) + (ulong)uVar17 + 0x100000000;
          if (uVar9 != auVar3._0_4_) {
            uVar7 = (ulong)uVar9 | uVar15 & 0xffffffff00000000;
          }
          uVar13 = uVar7 >> 0x20;
          uVar15 = uVar7;
        } while ((uVar17 != (uint)uVar7) || (auVar3._4_4_ != (int)(uVar7 >> 0x20)));
      }
      local_e0 = local_e0 / (double)(int)(uVar18 * uVar8);
      __return_storage_ptr__ = (Array2D<double> *)local_60;
      local_d4 = iVar10;
      FVar20 = pbrt::SummedAreaTable::Sum
                         ((SummedAreaTable *)(local_60 + 0x10),(Bounds2f *)__return_storage_ptr__);
      local_68 = (double)FVar20;
      if ((local_e0 != local_68) || (NAN(local_e0) || NAN(local_68))) {
        auVar21._0_8_ = (local_e0 - local_68) / local_e0;
        auVar21._8_8_ = 0;
        auVar19._8_8_ = 0x7fffffffffffffff;
        auVar19._0_8_ = 0x7fffffffffffffff;
        auVar19 = vandpd_avx512vl(auVar21,auVar19);
        local_d0._M_dataplus._M_p = (pointer)vmovlpd_avx(auVar19);
        local_e8.ptr_._0_4_ = 0x3a83126f;
        testing::internal::CmpHelperLT<double,float>
                  (local_88,"std::abs((ref - s) / ref)","1e-3f",(double *)&local_d0,
                   (float *)&local_e8);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_e8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_local_buf[0] = '\0';
          pbrt::detail::stringPrintfRecursive<double&,double&>
                    (&local_d0,"ref %f s %f",&local_e0,&local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_e8.ptr_ + 0x10),local_d0._M_dataplus._M_p,
                     local_d0._M_string_length);
          message = "";
          if (local_80.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message = ((local_80.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                     ,0x528,message);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_e8);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          if (local_e8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar5 = testing::internal::IsTrue(true);
            if ((bVar5) &&
               (local_e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_e8.ptr_ + 8))();
            }
            local_e8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        __return_storage_ptr__ = (Array2D<double> *)0x0;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      iVar10 = local_d4 + 1;
    } while (iVar10 != 100);
    pbrt::Array2D<double>::~Array2D((Array2D<double> *)(local_60 + 0x10));
    pbrt::Array2D<float>::~Array2D(&local_a8);
    local_78 = local_78 + 8;
  } while (local_78 != 0x30);
  return;
}

Assistant:

TEST(SummedArea, Randoms) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        for (int i = 0; i < 100; ++i) {
            Bounds2i bi({rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())},
                        {rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())});
            Bounds2f bf(Point2f(Float(bi.pMin.x) / Float(v.xSize()),
                                Float(bi.pMin.y) / Float(v.ySize())),
                        Point2f(Float(bi.pMax.x) / Float(v.xSize()),
                                Float(bi.pMax.y) / Float(v.ySize())));
            double ref = 0;

            for (Point2i p : bi)
                ref += v[p];
            ref /= v.xSize() * v.ySize();

            double s = sat.Sum(bf);
            if (ref != s)
                EXPECT_LT(std::abs((ref - s) / ref), 1e-3f)
                    << StringPrintf("ref %f s %f", ref, s);
        }
    }
}